

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

bool __thiscall wirehair::Codec::AllocateWorkspace(Codec *this)

{
  PeelRefs *pPVar1;
  ushort uVar2;
  uint8_t *puVar3;
  ulong size;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  PeelRow *pPVar8;
  ulong uVar9;
  
  uVar2 = this->_block_count;
  uVar9 = (ulong)uVar2;
  uVar6 = uVar2 + 1 + (uint)this->_mix_count;
  lVar7 = (ulong)this->_block_bytes * (ulong)uVar6;
  uVar5 = (ulong)((uint)this->_extra_count + (uint)uVar2);
  size = lVar7 + uVar9 * 0x48 + uVar5 * 0x19;
  if (this->_workspace_allocated < size) {
    if (this->_recovery_blocks != (uint8_t *)0x0) {
      SIMDSafeFree(this->_recovery_blocks);
      this->_recovery_blocks = (uint8_t *)0x0;
    }
    this->_workspace_allocated = 0;
    puVar3 = SIMDSafeAllocate(size);
    this->_recovery_blocks = puVar3;
    if (puVar3 == (uint8_t *)0x0) {
      return false;
    }
    this->_workspace_allocated = size;
  }
  pPVar8 = (PeelRow *)(this->_recovery_blocks + lVar7);
  this->_peel_rows = pPVar8;
  this->_peel_cols = (PeelColumn *)(pPVar8 + uVar5);
  pPVar1 = (PeelRefs *)((long)&pPVar8[uVar5].RecoveryId + uVar9 * 6);
  this->_peel_col_refs = pPVar1;
  this->_copied_original = (uint8_t *)(pPVar1->Rows + uVar9 + (ulong)uVar2 * 0x20 + -1);
  this->_recovery_rows = uVar6;
  if (this->_block_count != 0) {
    lVar7 = 0;
    lVar4 = 0;
    uVar5 = 0;
    do {
      *(undefined2 *)((long)this->_peel_col_refs->Rows + lVar4 + -2) = 0;
      *(undefined2 *)((long)&this->_peel_cols->field_1 + lVar7) = 0;
      (&this->_peel_cols->Mark)[lVar7] = '\0';
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x42;
      lVar7 = lVar7 + 6;
    } while (uVar5 < this->_block_count);
  }
  return true;
}

Assistant:

bool Codec::AllocateWorkspace()
{
    CAT_IF_DUMP(cout << endl << "---- AllocateWorkspace ----" << endl << endl;)

    // +1 for temporary space for MultiplyDenseValues()
    const unsigned recovery_rows = _block_count + _mix_count + 1;
    const uint64_t recoverySizeBytes = static_cast<uint64_t>(recovery_rows) * _block_bytes;

    // Count needed rows and columns
    const uint32_t row_count = _block_count + _extra_count;
    const uint32_t column_count = _block_count;

    // Calculate size
    const uint64_t sizeBytes = recoverySizeBytes
        + sizeof(PeelRow) * row_count
        + sizeof(PeelColumn) * column_count
        + sizeof(PeelRefs) * column_count
        + row_count;

    if (_workspace_allocated < sizeBytes)
    {
        FreeWorkspace();

        // Allocate workspace
        _recovery_blocks = SIMDSafeAllocate((size_t)sizeBytes);
        if (!_recovery_blocks) {
            return false;
        }
        _workspace_allocated = sizeBytes;
    }

    // Set pointers
    _peel_rows = reinterpret_cast<PeelRow *>( _recovery_blocks + recoverySizeBytes );
    _peel_cols = reinterpret_cast<PeelColumn *>( _peel_rows + row_count );
    _peel_col_refs = reinterpret_cast<PeelRefs *>( _peel_cols + column_count );
    _copied_original = reinterpret_cast<uint8_t *>( _peel_col_refs + column_count );

    _recovery_rows = recovery_rows;

    CAT_IF_DUMP(cout << "Memory overhead for workspace = " << sizeBytes << " bytes" << endl;)

    // Initialize columns
    for (unsigned ii = 0; ii < _block_count; ++ii)
    {
        _peel_col_refs[ii].RowCount = 0;
        _peel_cols[ii].Weight2Refs = 0;
        _peel_cols[ii].Mark = MARK_TODO;
    }

    return true;
}